

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResult.cpp
# Opt level: O0

void __thiscall
PipelineResult::PipelineResult
          (PipelineResult *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads,bool dead,
          float netRotation,Vec2d *netOffset)

{
  bool bVar1;
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar2;
  reference ppQVar3;
  Quad *this_00;
  Vec2d *this_01;
  Quad *local_50;
  Quad *local_48;
  Quad *quad;
  iterator __end1;
  iterator __begin1;
  vector<Quad_*,_std::allocator<Quad_*>_> *__range1;
  Vec2d *netOffset_local;
  float netRotation_local;
  bool dead_local;
  vector<Quad_*,_std::allocator<Quad_*>_> *quads_local;
  PipelineResult *this_local;
  
  pvVar2 = (vector<Quad_*,_std::allocator<Quad_*>_> *)operator_new(0x18);
  memset(pvVar2,0,0x18);
  std::vector<Quad_*,_std::allocator<Quad_*>_>::vector(pvVar2);
  this->quads = pvVar2;
  __end1 = std::vector<Quad_*,_std::allocator<Quad_*>_>::begin(quads);
  quad = (Quad *)std::vector<Quad_*,_std::allocator<Quad_*>_>::end(quads);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>
                                *)&quad);
    if (!bVar1) break;
    ppQVar3 = __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::
              operator*(&__end1);
    local_48 = *ppQVar3;
    pvVar2 = this->quads;
    this_00 = (Quad *)operator_new(0x20);
    Quad::Quad(this_00,local_48);
    local_50 = this_00;
    std::vector<Quad_*,_std::allocator<Quad_*>_>::push_back(pvVar2,&local_50);
    __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::operator++
              (&__end1);
  }
  this->dead = dead;
  this->netRotation = netRotation;
  this_01 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_01,netOffset);
  this->netOffset = this_01;
  return;
}

Assistant:

PipelineResult::PipelineResult(vector<Quad*>* quads, bool dead, float netRotation, Vec2d* netOffset) {
    this->quads = new vector<Quad*>();
    for (auto quad : *quads) {
        this->quads->push_back(new Quad(quad));
    }
    this->dead = dead;
    this->netRotation = netRotation;
    this->netOffset = new Vec2d(netOffset);
}